

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

void __thiscall pbrt::GBufferFilm::Pixel::Pixel(Pixel *this)

{
  undefined8 *in_RDI;
  double in_stack_ffffffffffffffb8;
  AtomicDouble *in_stack_ffffffffffffffc0;
  VarianceEstimator<float> *local_30;
  undefined8 *local_10;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  local_10 = in_RDI + 4;
  do {
    AtomicDouble::AtomicDouble(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_10 = local_10 + 1;
  } while (local_10 != in_RDI + 7);
  Point3<float>::Point3((Point3<float> *)0x6c21ba);
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  Normal3<float>::Normal3((Normal3<float> *)0x6c21da);
  Normal3<float>::Normal3((Normal3<float> *)0x6c21e8);
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  local_30 = (VarianceEstimator<float> *)(in_RDI + 0x10);
  do {
    VarianceEstimator<float>::VarianceEstimator(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (VarianceEstimator<float> *)(in_RDI + 0x16));
  return;
}

Assistant:

Pixel() = default;